

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

void __thiscall
SplitOnceTest_random_Test<char8_t>::TestBody(SplitOnceTest_random_Test<char8_t> *this)

{
  char8_t in_R8B;
  char *pcVar1;
  pair<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  split_result;
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  data;
  AssertHelper aAStack_e8 [8];
  Message local_e0;
  undefined7 uStack_df;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_c0;
  pair<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  local_b0;
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  local_70;
  
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::RandomTestData(&local_70,'\0',0,0);
  jessilib::
  split_once<std::__cxx11::u8string,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,char8_t>
            (&local_b0,(jessilib *)local_70.m_str._M_dataplus._M_p,
             (__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              )(local_70.m_str._M_dataplus._M_p + local_70.m_str._M_string_length),
             (__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              )0x0,in_R8B);
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)local_d0,"split_result.first","data.m_tokens[0]",&local_b0.first,
             local_70.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message(&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_e8);
    if ((long *)CONCAT71(uStack_df,local_e0) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_df,local_e0) + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::get_remainder((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                  local_d0,&local_70,1);
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)&local_e0,"split_result.second","data.get_remainder(1)",&local_b0.second,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_d0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
                     *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0._M_allocated_capacity + 1);
  }
  if (local_e0 == (Message)0x0) {
    testing::Message::Message((Message *)local_d0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x81,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_e8,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_e8);
    if ((long *)CONCAT71(local_d0._1_7_,local_d0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0._1_7_,local_d0[0]) + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
    operator_delete(local_b0.second._M_dataplus._M_p,
                    local_b0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
    operator_delete(local_b0.first._M_dataplus._M_p,local_b0.first.field_2._M_allocated_capacity + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_70.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_70.m_str._M_dataplus._M_p != &local_70.m_str.field_2) {
    operator_delete(local_70.m_str._M_dataplus._M_p,local_70.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_70.m_delim._M_dataplus._M_p != &local_70.m_delim.field_2) {
    operator_delete(local_70.m_delim._M_dataplus._M_p,
                    local_70.m_delim.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random) {
	RandomTestData<TypeParam> data{};
	std::pair<std::basic_string<TypeParam>, std::basic_string<TypeParam>> split_result = split_once(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}